

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_connection_state(Curl_easy *data,_Bool *done)

{
  uchar *plaintext;
  smb_conn_state sVar1;
  connectdata *conn;
  connectdata *pcVar2;
  char *pcVar3;
  long lVar4;
  CURLcode CVar5;
  size_t sVar6;
  size_t sVar7;
  void *msg;
  uchar lm [24];
  uchar nt_hash [21];
  uchar lm_hash [21];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  _Bool ssl_done;
  undefined1 local_44b [3];
  undefined4 local_448;
  undefined2 local_444;
  uint local_442;
  undefined4 local_43e;
  undefined4 local_436;
  short local_432;
  uchar local_430 [8];
  uchar auStack_428 [8];
  uchar local_420 [8];
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  char local_400;
  char cStack_3ff;
  undefined4 uStack_3fe;
  undefined2 uStack_3fa;
  undefined4 uStack_3f8;
  undefined1 auStack_3f4 [30];
  char acStack_3d6 [934];
  
  conn = data->conn;
  msg = (void *)0x0;
  if ((conn->proto).smbc.state == SMB_CONNECTING) {
    if ((conn->handler->flags & 1) != 0) {
      _ssl_done = _ssl_done & 0xff00;
      CVar5 = Curl_conn_connect(data,0,false,&ssl_done);
      if ((CVar5 != CURLE_OK) && (CVar5 != CURLE_AGAIN)) {
        return CVar5;
      }
      if (ssl_done != true) {
        return CURLE_OK;
      }
    }
    CVar5 = smb_send_message(data,'r',"",0xf);
    if (CVar5 != CURLE_OK) goto LAB_00142cd3;
    (data->conn->proto).smbc.state = SMB_NEGOTIATE;
  }
  CVar5 = smb_send_and_recv(data,&msg);
  if ((CVar5 != CURLE_OK) && (CVar5 != CURLE_AGAIN)) {
LAB_00142cd3:
    Curl_conncontrol(conn,1);
    return CVar5;
  }
  if (msg == (void *)0x0) {
    return CURLE_OK;
  }
  sVar1 = (conn->proto).smbc.state;
  if (sVar1 == SMB_SETUP) {
    if (*(int *)((long)msg + 9) != 0) {
      Curl_conncontrol(conn,1);
      return CURLE_LOGIN_DENIED;
    }
    (conn->proto).smbc.uid = *(unsigned_short *)((long)msg + 0x20);
    (data->conn->proto).smbc.state = SMB_CONNECTED;
    *done = true;
  }
  else if (sVar1 == SMB_NEGOTIATE) {
    if (((conn->proto).ftpc.pp.sendbuf.allc < 0x51) || (*(int *)((long)msg + 9) != 0)) {
      Curl_conncontrol(conn,1);
      return CURLE_COULDNT_CONNECT;
    }
    (conn->proto).ftpc.pp.sendsize = *(size_t *)((long)msg + 0x49);
    (conn->proto).smbc.session_key = *(uint *)((long)msg + 0x34);
    pcVar2 = data->conn;
    sVar6 = strlen((pcVar2->proto).smbc.user);
    sVar7 = strlen((pcVar2->proto).smbc.domain);
    if ((sVar7 + sVar6) - 0x3c4 < 0xfffffffffffffbff) {
      CVar5 = CURLE_FILESIZE_EXCEEDED;
    }
    else {
      Curl_ntlm_core_mk_lm_hash(pcVar2->passwd,lm_hash);
      plaintext = (pcVar2->proto).smbc.challenge;
      Curl_ntlm_core_lm_resp(lm_hash,plaintext,lm);
      Curl_ntlm_core_mk_nt_hash(pcVar2->passwd,nt_hash);
      Curl_ntlm_core_lm_resp(nt_hash,plaintext,(uchar *)&local_468);
      memset(local_44b,0,0x41b);
      _ssl_done = 0xff0d;
      local_448 = 0x19000;
      local_444 = 1;
      local_442 = (pcVar2->proto).smbc.session_key;
      local_436 = 8;
      local_43e = 0x180018;
      local_420[0] = lm[0x10];
      local_420[1] = lm[0x11];
      local_420[2] = lm[0x12];
      local_420[3] = lm[0x13];
      local_420[4] = lm[0x14];
      local_420[5] = lm[0x15];
      local_420[6] = lm[0x16];
      local_420[7] = lm[0x17];
      local_430[0] = lm[0];
      local_430[1] = lm[1];
      local_430[2] = lm[2];
      local_430[3] = lm[3];
      local_430[4] = lm[4];
      local_430[5] = lm[5];
      local_430[6] = lm[6];
      local_430[7] = lm[7];
      auStack_428[0] = lm[8];
      auStack_428[1] = lm[9];
      auStack_428[2] = lm[10];
      auStack_428[3] = lm[0xb];
      auStack_428[4] = lm[0xc];
      auStack_428[5] = lm[0xd];
      auStack_428[6] = lm[0xe];
      auStack_428[7] = lm[0xf];
      local_408 = local_458;
      local_418 = local_468;
      uStack_410 = uStack_460;
      pcVar3 = (pcVar2->proto).smbc.user;
      strcpy(&local_400,pcVar3);
      sVar6 = strlen(pcVar3);
      pcVar3 = (pcVar2->proto).smbc.domain;
      strcpy(&cStack_3ff + sVar6,pcVar3);
      sVar7 = strlen(pcVar3);
      lVar4 = sVar7 + sVar6;
      *(undefined4 *)((long)&uStack_3fe + lVar4) = 0x756e694c;
      *(undefined2 *)((long)&uStack_3fa + lVar4) = 0x78;
      *(undefined4 *)(auStack_3f4 + lVar4 + -4) = 0x6c727563;
      auStack_3f4[lVar4] = 0;
      local_432 = (short)(&cStack_3ff + (lVar4 - (long)local_430)) + 0xc;
      CVar5 = smb_send_message(data,'s',&ssl_done,
                               (size_t)(&cStack_3ff + (lVar4 - (long)local_430) + 0x29));
      if (CVar5 == CURLE_OK) {
        (data->conn->proto).smbc.state = SMB_SETUP;
        goto LAB_00142d17;
      }
    }
    Curl_conncontrol(conn,1);
    return CVar5;
  }
LAB_00142d17:
  (conn->proto).ftpc.pp.sendbuf.allc = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode smb_connection_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_negotiate_response *nrsp;
  struct smb_header *h;
  CURLcode result;
  void *msg = NULL;

  if(smbc->state == SMB_CONNECTING) {
#ifdef USE_SSL
    if((conn->handler->flags & PROTOPT_SSL)) {
      bool ssl_done = FALSE;
      result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssl_done);
      if(result && result != CURLE_AGAIN)
        return result;
      if(!ssl_done)
        return CURLE_OK;
    }
#endif

    result = smb_send_negotiate(data);
    if(result) {
      connclose(conn, "SMB: failed to send negotiate message");
      return result;
    }

    conn_state(data, SMB_NEGOTIATE);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(smbc->state) {
  case SMB_NEGOTIATE:
    if((smbc->got < sizeof(*nrsp) + sizeof(smbc->challenge) - 1) ||
       h->status) {
      connclose(conn, "SMB: negotiation failed");
      return CURLE_COULDNT_CONNECT;
    }
    nrsp = msg;
    memcpy(smbc->challenge, nrsp->bytes, sizeof(smbc->challenge));
    smbc->session_key = smb_swap32(nrsp->session_key);
    result = smb_send_setup(data);
    if(result) {
      connclose(conn, "SMB: failed to send setup message");
      return result;
    }
    conn_state(data, SMB_SETUP);
    break;

  case SMB_SETUP:
    if(h->status) {
      connclose(conn, "SMB: authentication failed");
      return CURLE_LOGIN_DENIED;
    }
    smbc->uid = smb_swap16(h->uid);
    conn_state(data, SMB_CONNECTED);
    *done = true;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  return CURLE_OK;
}